

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_bamfout(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  char *__format;
  char buf [4608];
  char acStack_1218 [4616];
  
  bVar1 = is_npc(ch);
  if (!bVar1) {
    smash_tilde(argument);
    if (*argument == '\0') {
      pcVar2 = ch->pcdata->bamfout;
      __format = "Your poofout is %s\n\r";
    }
    else {
      pcVar2 = strstr(argument,ch->name);
      if (pcVar2 == (char *)0x0) {
        send_to_char("You must include your name.\n\r",ch);
        return;
      }
      free_pstring(ch->pcdata->bamfout);
      pcVar2 = palloc_string(argument);
      ch->pcdata->bamfout = pcVar2;
      __format = "Your poofout is now %s\n\r";
    }
    sprintf(acStack_1218,__format,pcVar2);
    send_to_char(acStack_1218,ch);
  }
  return;
}

Assistant:

void do_bamfout(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];

	if (!is_npc(ch))
	{
		smash_tilde(argument);

		if (argument[0] == '\0')
		{
			sprintf(buf, "Your poofout is %s\n\r", ch->pcdata->bamfout);
			send_to_char(buf, ch);
			return;
		}

		if (strstr(argument, ch->name) == nullptr)
		{
			send_to_char("You must include your name.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->bamfout);
		ch->pcdata->bamfout = palloc_string(argument);

		sprintf(buf, "Your poofout is now %s\n\r", ch->pcdata->bamfout);
		send_to_char(buf, ch);
	}
}